

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  ReflectionSchema *this_00;
  FieldDescriptor *field;
  uint uVar1;
  bool bVar2;
  int iVar3;
  UnknownFieldSet *this_01;
  size_t sVar4;
  size_t sVar5;
  RepeatedField<int> *pRVar6;
  string *psVar7;
  Message **ppMVar8;
  undefined4 extraout_var;
  long *plVar9;
  ArenaStringPtr *pAVar10;
  MapFieldBase *this_02;
  RepeatedField<bool> *pRVar11;
  RepeatedField<unsigned_long> *pRVar12;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar13;
  RepeatedPtrFieldBase *pRVar14;
  Rep *pRVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  uVar1 = (this->schema_).object_size_;
  uVar17 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uint)(this->schema_).metadata_offset_);
  if ((uVar17 & 1) == 0) {
    this_01 = UnknownFieldSet::default_instance();
  }
  else {
    this_01 = (UnknownFieldSet *)(uVar17 & 0xfffffffffffffffe);
  }
  sVar4 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_01);
  sVar4 = sVar4 + uVar1;
  uVar17 = (ulong)(uint)(this->schema_).extensions_offset_;
  if (uVar17 != 0xffffffff) {
    sVar5 = internal::ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + uVar17));
    sVar4 = sVar4 + sVar5;
  }
  if (-1 < this->last_non_weak_field_index_) {
    this_00 = &this->schema_;
    lVar19 = 0;
    do {
      field = (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar19 * 0x98);
      if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c + lVar19 * 0x98) != 3) {
        lVar20 = *(long *)(field + 0x58);
        if ((lVar20 != 0) &&
           (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (ulong)(uint)((int)((ulong)(lVar20 - *(long *)(*(long *)(lVar20 + 0x10) + 0x30))
                                       >> 4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
            *(int *)(field + 0x44))) goto switchD_0027d988_default;
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_38 = FieldDescriptor::TypeOnceInit;
          local_40 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),&local_38,&local_40);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10)
        {
          if (this_00->default_instance_ != message) {
            ppMVar8 = GetRaw<google::protobuf::Message_const*>(this,message,field);
            if (*ppMVar8 != (Message *)0x0) {
              iVar3 = (*((*ppMVar8)->super_MessageLite)._vptr_MessageLite[0x13])();
              sVar5 = CONCAT44(extraout_var,iVar3);
              goto LAB_0027db67;
            }
          }
          goto switchD_0027d988_default;
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9)
        goto switchD_0027d988_default;
        bVar2 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
        if (!bVar2) {
          plVar9 = (long *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
          psVar7 = (string *)*plVar9;
          pAVar10 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          if (pAVar10->ptr_ != psVar7) {
            sVar5 = internal::StringSpaceUsedExcludingSelfLong(pAVar10->ptr_);
            sVar4 = sVar4 + sVar5 + 0x20;
          }
          goto switchD_0027d988_default;
        }
        psVar7 = (string *)
                 GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
        sVar5 = internal::StringSpaceUsedExcludingSelfLong(psVar7);
        goto LAB_0027db67;
      }
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_38,&local_40);
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
      case 1:
      case 8:
        pRVar6 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        goto LAB_0027db4f;
      case 2:
        pRVar12 = (RepeatedField<unsigned_long> *)
                  GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
        goto LAB_0027db30;
      case 3:
        pRVar6 = (RepeatedField<int> *)
                 GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
        goto LAB_0027db4f;
      case 4:
        pRVar12 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
        goto LAB_0027db30;
      case 5:
        pRVar12 = (RepeatedField<unsigned_long> *)
                  GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
LAB_0027db30:
        lVar18 = (long)pRVar12->total_size_;
        lVar20 = lVar18 * 8;
        goto LAB_0027db5e;
      case 6:
        pRVar6 = (RepeatedField<int> *)
                 GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
LAB_0027db4f:
        lVar18 = (long)pRVar6->total_size_;
        lVar20 = lVar18 * 4;
LAB_0027db5e:
        sVar5 = lVar20 + 8;
        if (lVar18 < 1) {
          sVar5 = 0;
        }
LAB_0027db67:
        sVar4 = sVar4 + sVar5;
        break;
      case 7:
        pRVar11 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
        uVar17 = (ulong)(pRVar11->total_size_ + 8);
        if (pRVar11->total_size_ < 1) {
          uVar17 = 0;
        }
        sVar4 = sVar4 + uVar17;
        break;
      case 9:
        pRVar13 = GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            (this,message,field);
        lVar20 = (long)(pRVar13->super_RepeatedPtrFieldBase).total_size_ << 3;
        pRVar15 = (pRVar13->super_RepeatedPtrFieldBase).rep_;
        if (pRVar15 != (Rep *)0x0) {
          if (0 < pRVar15->allocated_size) {
            lVar18 = 0;
            do {
              sVar5 = internal::StringSpaceUsedExcludingSelfLong
                                ((string *)pRVar15->elements[lVar18]);
              lVar20 = lVar20 + sVar5 + 0x20;
              lVar18 = lVar18 + 1;
              pRVar15 = (pRVar13->super_RepeatedPtrFieldBase).rep_;
            } while (lVar18 < pRVar15->allocated_size);
          }
LAB_0027dc14:
          lVar20 = lVar20 + 8;
        }
        goto LAB_0027dc1d;
      case 10:
        bVar2 = anon_unknown_0::IsMapFieldInApi(field);
        if (bVar2) {
          this_02 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
          sVar5 = internal::MapFieldBase::SpaceUsedExcludingSelfLong(this_02);
          goto LAB_0027db67;
        }
        pRVar14 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        lVar20 = (long)pRVar14->total_size_ << 3;
        pRVar15 = pRVar14->rep_;
        if (pRVar15 != (Rep *)0x0) {
          if (0 < pRVar15->allocated_size) {
            lVar18 = 0;
            do {
              lVar16 = (**(code **)(*pRVar15->elements[lVar18] + 0x98))();
              lVar20 = lVar20 + lVar16;
              lVar18 = lVar18 + 1;
              pRVar15 = pRVar14->rep_;
            } while (lVar18 < pRVar15->allocated_size);
          }
          goto LAB_0027dc14;
        }
LAB_0027dc1d:
        sVar4 = sVar4 + lVar20;
      }
switchD_0027d988_default:
      bVar2 = lVar19 < this->last_non_weak_field_index_;
      lVar19 = lVar19 + 1;
    } while (bVar2);
  }
  return sVar4;
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
                break;
              }

              // Initially, the string points to the default value stored
              // in the prototype. Only count the string if it has been
              // changed from the default value.
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const std::string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}